

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIRResampler.cpp
# Opt level: O0

void __thiscall
SRCTools::FIRResampler::process
          (FIRResampler *this,FloatSample **inSamples,uint *inLength,FloatSample **outSamples,
          uint *outLength)

{
  bool bVar1;
  uint *outLength_local;
  FloatSample **outSamples_local;
  uint *inLength_local;
  FloatSample **inSamples_local;
  FIRResampler *this_local;
  
  do {
    if (*outLength == 0) {
      return;
    }
    while (bVar1 = needNextInSample(this), bVar1) {
      if (*inLength == 0) {
        return;
      }
      addInSamples(this,inSamples);
      *inLength = *inLength - 1;
    }
    getOutSamplesStereo(this,outSamples);
    *outLength = *outLength - 1;
  } while( true );
}

Assistant:

void FIRResampler::process(const FloatSample *&inSamples, unsigned int &inLength, FloatSample *&outSamples, unsigned int &outLength) {
	while (outLength > 0) {
		while (needNextInSample()) {
			if (inLength == 0) return;
			addInSamples(inSamples);
			--inLength;
		}
		getOutSamplesStereo(outSamples);
		--outLength;
	}
}